

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_linear.c
# Opt level: O2

SRC_ERROR linear_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  double dVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  SRC_ERROR SVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  lVar7 = data->input_frames;
  if (lVar7 < 1) {
    return SRC_ERR_NO_ERROR;
  }
  pvVar3 = state->private_data;
  if (pvVar3 == (void *)0x0) {
    return SRC_ERR_NO_PRIVATE;
  }
  uVar2 = state->channels;
  lVar12 = (long)(int)uVar2;
  if (*(char *)((long)pvVar3 + 4) == '\0') {
    uVar6 = 0;
    uVar8 = 0;
    if (0 < (int)uVar2) {
      uVar8 = (ulong)uVar2;
    }
    for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      *(float *)(*(long *)((long)pvVar3 + 0x28) + uVar6 * 4) = data->data_in[uVar6];
    }
    *(undefined1 *)((long)pvVar3 + 4) = 1;
  }
  lVar7 = lVar7 * lVar12;
  *(long *)((long)pvVar3 + 8) = lVar7;
  lVar9 = data->output_frames * lVar12;
  *(long *)((long)pvVar3 + 0x18) = lVar9;
  *(undefined8 *)((long)pvVar3 + 0x20) = 0;
  *(undefined8 *)((long)pvVar3 + 0x10) = 0;
  dVar1 = state->last_ratio;
  SVar5 = SRC_ERR_BAD_INTERNAL_STATE;
  if ((0.00390625 <= dVar1) && (dVar1 <= 256.0)) {
    dVar15 = state->last_position;
    lVar11 = 0;
    uVar6 = 0;
    dVar16 = dVar1;
    if (0 < (int)uVar2) {
      uVar6 = (ulong)uVar2;
    }
    while (((dVar15 < 1.0 && (lVar11 < lVar9)) &&
           ((dVar15 + 1.0) * (double)(int)uVar2 + 0.0 < (double)lVar7))) {
      if ((0 < lVar9) && (1e-20 < ABS(dVar1 - data->src_ratio))) {
        dVar16 = ((data->src_ratio - dVar1) * (double)lVar11) / (double)lVar9 + dVar1;
      }
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        dVar17 = (double)*(float *)(*(long *)((long)pvVar3 + 0x28) + uVar8 * 4);
        data->data_out[lVar11] = (float)(((double)data->data_in[uVar8] - dVar17) * dVar15 + dVar17);
        lVar11 = lVar11 + 1;
        *(long *)((long)pvVar3 + 0x20) = lVar11;
      }
      dVar15 = dVar15 + 1.0 / dVar16;
    }
    dVar17 = dVar15 - (double)(int)ROUND(dVar15);
    dVar17 = (double)(~-(ulong)(dVar17 < 0.0) & (ulong)dVar17 |
                     (ulong)(dVar17 + 1.0) & -(ulong)(dVar17 < 0.0));
    for (lVar14 = (long)(int)((int)ROUND(dVar15 - dVar17) * uVar2);
        (lVar11 < lVar9 && ((double)(int)uVar2 * dVar17 + (double)lVar14 < (double)lVar7));
        lVar14 = lVar14 + (int)((int)ROUND(dVar15 - dVar17) * uVar2)) {
      if ((0 < lVar9) && (1e-20 < ABS(dVar1 - data->src_ratio))) {
        dVar16 = ((data->src_ratio - dVar1) * (double)lVar11) / (double)lVar9 + dVar1;
      }
      lVar10 = lVar14;
      lVar4 = lVar11;
      for (lVar13 = 0; -lVar13 != uVar6; lVar13 = lVar13 + -1) {
        dVar15 = (double)data->data_in[lVar10 - lVar12];
        data->data_out[lVar4] = (float)(((double)data->data_in[lVar10] - dVar15) * dVar17 + dVar15);
        *(long *)((long)pvVar3 + 0x20) = lVar4 + 1;
        lVar10 = lVar10 + 1;
        lVar4 = lVar4 + 1;
      }
      dVar15 = dVar17 + 1.0 / dVar16;
      dVar17 = dVar15 - (double)(int)ROUND(dVar15);
      dVar17 = (double)(~-(ulong)(dVar17 < 0.0) & (ulong)dVar17 |
                       (ulong)(dVar17 + 1.0) & -(ulong)(dVar17 < 0.0));
      lVar11 = lVar11 - lVar13;
    }
    if (lVar14 - lVar7 != 0 && lVar7 <= lVar14) {
      dVar17 = dVar17 + (double)((lVar14 - lVar7) / lVar12);
      lVar14 = lVar7;
    }
    *(long *)((long)pvVar3 + 0x10) = lVar14;
    state->last_position = dVar17;
    if (0 < lVar14) {
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        *(float *)(*(long *)((long)pvVar3 + 0x28) + uVar8 * 4) =
             data->data_in[(lVar14 + uVar8) - lVar12];
      }
    }
    state->last_ratio = dVar16;
    data->input_frames_used = lVar14 / lVar12;
    data->output_frames_gen = lVar11 / lVar12;
    SVar5 = SRC_ERR_NO_ERROR;
  }
  return SVar5;
}

Assistant:

static SRC_ERROR
linear_vari_process (SRC_STATE *state, SRC_DATA *data)
{	LINEAR_DATA *priv ;
	double		src_ratio, input_index, rem ;
	int			ch ;

	if (data->input_frames <= 0)
		return SRC_ERR_NO_ERROR ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	priv = (LINEAR_DATA*) state->private_data ;

	if (!priv->dirty)
	{	/* If we have just been reset, set the last_value data. */
		for (ch = 0 ; ch < state->channels ; ch++)
			priv->last_value [ch] = data->data_in [ch] ;
		priv->dirty = true ;
		} ;

	priv->in_count = data->input_frames * state->channels ;
	priv->out_count = data->output_frames * state->channels ;
	priv->in_used = priv->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	input_index = state->last_position ;

	/* Calculate samples before first sample in input array. */
	while (input_index < 1.0 && priv->out_gen < priv->out_count)
	{
		if (priv->in_used + state->channels * (1.0 + input_index) >= priv->in_count)
			break ;

		if (priv->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = state->last_ratio + priv->out_gen * (data->src_ratio - state->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < state->channels ; ch++)
		{	data->data_out [priv->out_gen] = (float) (priv->last_value [ch] + input_index *
										((double) data->data_in [ch] - priv->last_value [ch])) ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		} ;

	rem = fmod_one (input_index) ;
	priv->in_used += state->channels * psf_lrint (input_index - rem) ;
	input_index = rem ;

	/* Main processing loop. */
	while (priv->out_gen < priv->out_count && priv->in_used + state->channels * input_index < priv->in_count)
	{
		if (priv->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = state->last_ratio + priv->out_gen * (data->src_ratio - state->last_ratio) / priv->out_count ;

#if SRC_DEBUG
		if (priv->in_used < state->channels && input_index < 1.0)
		{	printf ("Whoops!!!!   in_used : %ld     channels : %d     input_index : %f\n", priv->in_used, state->channels, input_index) ;
			exit (1) ;
			} ;
#endif

		for (ch = 0 ; ch < state->channels ; ch++)
		{	data->data_out [priv->out_gen] = (float) (data->data_in [priv->in_used - state->channels + ch] + input_index *
						((double) data->data_in [priv->in_used + ch] - data->data_in [priv->in_used - state->channels + ch])) ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		priv->in_used += state->channels * psf_lrint (input_index - rem) ;
		input_index = rem ;
		} ;

	if (priv->in_used > priv->in_count)
	{	input_index += (priv->in_used - priv->in_count) / state->channels ;
		priv->in_used = priv->in_count ;
		} ;

	state->last_position = input_index ;

	if (priv->in_used > 0)
		for (ch = 0 ; ch < state->channels ; ch++)
			priv->last_value [ch] = data->data_in [priv->in_used - state->channels + ch] ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = priv->in_used / state->channels ;
	data->output_frames_gen = priv->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}